

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

bool Imath_3_2::extractAndRemoveScalingAndShear<float>
               (Matrix44<float> *mat,Vec3<float> *scl,Vec3<float> *shr,bool exc)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Vec3<float> *pVVar4;
  long lVar5;
  long lVar6;
  Vec3<float> *this;
  float *pfVar7;
  int i_1;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uStack_70;
  Vec3<float> local_68;
  Vec3<float> VStack_5c;
  Vec3<float> VStack_50;
  float local_3c;
  Vec3<float> *local_38;
  
  pVVar4 = &local_68;
  this = &local_68;
  local_68.x = *(float *)((long)(mat->x + 0) + 0);
  local_68.y = *(float *)((long)(mat->x + 0) + 4);
  local_68.z = SUB164(*(undefined1 (*) [16])(mat->x[0] + 1),4);
  uVar1 = *(undefined8 *)mat->x[2];
  VStack_5c.x = mat->x[1][0];
  VStack_5c.y = mat->x[1][1];
  VStack_5c.z = mat->x[1][2];
  VStack_50.x = (float)uVar1;
  VStack_50.y = (float)((ulong)uVar1 >> 0x20);
  VStack_50.z = mat->x[2][2];
  local_3c = 0.0;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      fVar8 = *(float *)((long)pVVar4 + lVar5 * 4);
      if (fVar8 <= -fVar8) {
        fVar8 = -fVar8;
      }
      if (fVar8 <= local_3c) {
        fVar8 = local_3c;
      }
      local_3c = fVar8;
    }
    pVVar4 = (Vec3<float> *)((long)pVVar4 + 0xc);
  }
  local_38 = shr;
  if ((local_3c != 0.0) || (NAN(local_3c))) {
    for (lVar6 = 0; lVar6 != 0x24; lVar6 = lVar6 + 0xc) {
      pVVar4 = (Vec3<float> *)((long)&local_68.x + lVar6);
      uStack_70 = 0x124ae2;
      bVar3 = checkForZeroScaleInRow<float>(&local_3c,pVVar4,exc);
      if (!bVar3) {
        return false;
      }
      uStack_70 = 0x124af8;
      Vec3<float>::operator/=(pVVar4,local_3c);
    }
  }
  uStack_70 = 0x124b09;
  fVar8 = Vec3<float>::length(&local_68);
  scl->x = fVar8;
  uStack_70 = 0x124b1a;
  bVar3 = checkForZeroScaleInRow<float>(&scl->x,&local_68,exc);
  pVVar4 = local_38;
  if (bVar3) {
    fVar8 = scl->x;
    auVar11._8_8_ = 0;
    auVar11._0_4_ = local_68.x;
    auVar11._4_4_ = local_68.y;
    auVar12._4_4_ = fVar8;
    auVar12._0_4_ = fVar8;
    auVar12._8_4_ = fVar8;
    auVar12._12_4_ = fVar8;
    auVar12 = divps(auVar11,auVar12);
    local_68._0_8_ = auVar12._0_8_;
    local_68.z = local_68.z / fVar8;
    fVar8 = local_68.z * VStack_5c.z + auVar12._0_4_ * VStack_5c.x + auVar12._4_4_ * VStack_5c.y;
    local_38->x = fVar8;
    VStack_5c._0_8_ =
         CONCAT44(VStack_5c.y - fVar8 * auVar12._4_4_,VStack_5c.x - fVar8 * auVar12._0_4_);
    VStack_5c.z = VStack_5c.z - local_68.z * fVar8;
    uStack_70 = 0x124ba8;
    fVar8 = Vec3<float>::length(&VStack_5c);
    scl->y = fVar8;
    uStack_70 = 0x124bbb;
    bVar3 = checkForZeroScaleInRow<float>(&scl->y,&VStack_5c,exc);
    if (bVar3) {
      fVar8 = scl->y;
      auVar9._8_8_ = 0;
      auVar9._0_4_ = VStack_5c.x;
      auVar9._4_4_ = VStack_5c.y;
      auVar13._4_4_ = fVar8;
      auVar13._0_4_ = fVar8;
      auVar13._8_4_ = fVar8;
      auVar13._12_4_ = fVar8;
      auVar12 = divps(auVar9,auVar13);
      VStack_5c._0_8_ = auVar12._0_8_;
      VStack_5c.z = VStack_5c.z / fVar8;
      pVVar4->x = pVVar4->x / fVar8;
      fVar8 = local_68.z * VStack_50.z + local_68.x * VStack_50.x + local_68.y * VStack_50.y;
      pVVar4->y = fVar8;
      VStack_50.x = VStack_50.x - fVar8 * local_68.x;
      VStack_50.y = VStack_50.y - fVar8 * local_68.y;
      VStack_50.z = VStack_50.z - local_68.z * fVar8;
      fVar8 = VStack_5c.z * VStack_50.z + auVar12._0_4_ * VStack_50.x + auVar12._4_4_ * VStack_50.y;
      pVVar4->z = fVar8;
      VStack_50._0_8_ =
           CONCAT44(VStack_50.y - fVar8 * auVar12._4_4_,VStack_50.x - fVar8 * auVar12._0_4_);
      VStack_50.z = VStack_50.z - VStack_5c.z * fVar8;
      uStack_70 = 0x124c96;
      fVar8 = Vec3<float>::length(&VStack_50);
      pfVar7 = &scl->z;
      scl->z = fVar8;
      uStack_70 = 0x124cae;
      bVar3 = checkForZeroScaleInRow<float>(pfVar7,&VStack_50,exc);
      if (bVar3) {
        fVar8 = *pfVar7;
        auVar10._8_8_ = 0;
        auVar10._0_4_ = VStack_50.x;
        auVar10._4_4_ = VStack_50.y;
        auVar2._4_4_ = fVar8;
        auVar2._0_4_ = fVar8;
        auVar2._8_4_ = fVar8;
        auVar2._12_4_ = fVar8;
        auVar12 = divps(auVar10,auVar2);
        VStack_50.x = (float)auVar12._0_8_;
        VStack_50.y = SUB84(auVar12._0_8_,4);
        VStack_50.z = VStack_50.z / fVar8;
        pVVar4->y = pVVar4->y / fVar8;
        pVVar4->z = pVVar4->z / *pfVar7;
        if ((auVar12._4_4_ * VStack_5c.x - auVar12._0_4_ * VStack_5c.y) * local_68.z +
            (VStack_5c.y * VStack_50.z - auVar12._4_4_ * VStack_5c.z) * local_68.x +
            (VStack_5c.z * auVar12._0_4_ - VStack_50.z * VStack_5c.x) * local_68.y < 0.0) {
          for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
            (&scl->x)[lVar6] = -(&scl->x)[lVar6];
            uStack_70 = 0x124d93;
            Vec3<float>::operator*=(this,-1.0);
            this = this + 1;
          }
        }
        pfVar7 = mat->x[0] + 2;
        for (lVar6 = 8; lVar6 != 0x2c; lVar6 = lVar6 + 0xc) {
          *(undefined8 *)*(float (*) [4])(pfVar7 + -2) = *(undefined8 *)((long)&uStack_70 + lVar6);
          *pfVar7 = *(float *)((long)&local_68.x + lVar6);
          pfVar7 = pfVar7 + 4;
        }
        uStack_70 = 0x124def;
        Vec3<float>::operator*=(scl,local_3c);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (
    Matrix44<T>& mat, Vec3<T>& scl, Vec3<T>& shr, bool exc)
{
    //
    // This implementation follows the technique described in the paper by
    // Spencer W. Thomas in the Graphics Gems II article: "Decomposing a
    // Matrix into Simple Transformations", p. 320.
    //

    Vec3<T> row[3];

    row[0] = Vec3<T> (mat[0][0], mat[0][1], mat[0][2]);
    row[1] = Vec3<T> (mat[1][0], mat[1][1], mat[1][2]);
    row[2] = Vec3<T> (mat[2][0], mat[2][1], mat[2][2]);

    T maxVal = 0;
    for (int i = 0; i < 3; i++)
        for (int j = 0; j < 3; j++)
            if (IMATH_INTERNAL_NAMESPACE::abs (row[i][j]) > maxVal)
                maxVal = IMATH_INTERNAL_NAMESPACE::abs (row[i][j]);

    //
    // We normalize the 3x3 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 3x3 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the
    // scaling factors by maxVal at the end (shear and rotation are not
    // affected by the normalization).

    if (maxVal != 0)
    {
        for (int i = 0; i < 3; i++)
            if (!checkForZeroScaleInRow (maxVal, row[i], exc))
                return false;
            else
                row[i] /= maxVal;
    }

    // Compute X scale factor.
    scl.x = row[0].length ();
    if (!checkForZeroScaleInRow (scl.x, row[0], exc)) return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 6 combinations (XY, XZ, YZ, YX, ZX, ZY), although we only
    // extract the first 3 because we can effect the last 3 by shearing in
    // XY, XZ, YZ combined rotations and scales.
    //
    // shear matrix <   1,  YX,  ZX,  0,
    //                 XY,   1,  ZY,  0,
    //                 XZ,  YZ,   1,  0,
    //                  0,   0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr[0] = row[0].dot (row[1]);
    row[1] -= shr[0] * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (!checkForZeroScaleInRow (scl.y, row[1], exc)) return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y;
    shr[0] /= scl.y;

    // Compute XZ and YZ shears, orthogonalize 3rd row.
    shr[1] = row[0].dot (row[2]);
    row[2] -= shr[1] * row[0];
    shr[2] = row[1].dot (row[2]);
    row[2] -= shr[2] * row[1];

    // Next, get Z scale.
    scl.z = row[2].length ();
    if (!checkForZeroScaleInRow (scl.z, row[2], exc)) return false;

    // Normalize 3rd row and correct the XZ and YZ shear factors for Z scaling.
    row[2] /= scl.z;
    shr[1] /= scl.z;
    shr[2] /= scl.z;

    // At this point, the upper 3x3 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is less than zero, then negate the matrix and the scaling factors.
    if (row[0].dot (row[1].cross (row[2])) < 0)
        for (int i = 0; i < 3; i++)
        {
            scl[i] *= -1;
            row[i] *= -1;
        }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 3x3 matrix in mat is now a rotation matrix.
    for (int i = 0; i < 3; i++)
    {
        mat[i][0] = row[i][0];
        mat[i][1] = row[i][1];
        mat[i][2] = row[i][2];
    }

    // Correct the scaling factors for the normalization step that we
    // performed above; shear and rotation are not affected by the
    // normalization.
    scl *= maxVal;

    return true;
}